

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_0053e080;
  SharedCtor(this,arena);
  return;
}

Assistant:

explicit InternalMetadata(Arena* arena) {
    ptr_ = reinterpret_cast<intptr_t>(arena);
  }